

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O3

void __thiscall
ADSBBase::ProcessV2(ADSBBase *this,JSON_Object *pJAc,FDKeyTy *fdKey,double tBufPeriod,
                   double adsbxTime,positionTy *viewPos)

{
  pointer pcVar1;
  posFlagsTy pVar2;
  bool bVar3;
  int iVar4;
  JSON_Value_Type JVar5;
  char *pcVar6;
  JSON_Value *value;
  mapped_type *this_00;
  long lVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  string cat;
  string acTy;
  unique_lock<std::mutex> mapFdLock;
  string reg;
  FDDynamicData dyn;
  FDStaticData stat;
  positionTy local_2f0;
  string local_2a8;
  long *local_288;
  long local_280;
  long local_278 [2];
  unique_lock<std::mutex> local_268;
  long *local_258;
  long local_250;
  long local_248 [2];
  double local_238;
  string local_230;
  FDDynamicData local_210;
  undefined1 local_1c8 [64];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  char *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  int local_100;
  bool local_fc;
  Doc8643 *local_f8;
  _Alloc_hider local_f0;
  char *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pointer local_d0;
  pointer pbStack_c8;
  pointer local_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  dVar9 = json_object_dotget_number(pJAc,"seen_pos");
  if (dVar9 < tBufPeriod) {
    pcVar6 = jog_s(pJAc,"type");
    iVar4 = strcmp(pcVar6,"tisb_other");
    if (iVar4 != 0) {
      dVar10 = jog_n_nan(pJAc,"lat");
      dVar11 = jog_n_nan(pJAc,"lon");
      local_238 = jog_n_nan(pJAc,"alt_geom");
      local_238 = local_238 * 0.3048;
      local_2f0._head = jog_n_nan(pJAc,"true_heading");
      local_2f0._alt = local_238;
      local_2f0._pitch = NAN;
      local_2f0._roll = NAN;
      local_2f0.mergeCount = 1;
      local_2f0.f = (posFlagsTy)0x0;
      pVar2 = local_2f0.f;
      local_2f0.f = (posFlagsTy)0x0;
      local_2f0.edgeIdx = 0xffffffffffffffff;
      local_2f0._lat = dVar10;
      local_2f0._lon = dVar11;
      local_2f0._ts = adsbxTime - dVar9;
      if (NAN(local_2f0._head)) {
        local_2f0.f = pVar2;
        local_2f0._head = jog_n_nan(pJAc,"track");
      }
      if ((!NAN(dVar10) && !NAN(dVar11)) &&
         (dVar9 = CoordDistance(&local_2f0,viewPos),
         dVar9 <= (double)(dataRefs.fdStdDistance * 0x73c))) {
        value = json_object_get_value(pJAc,"alt_baro");
        if (value != (JSON_Value *)0x0) {
          JVar5 = json_value_get_type(value);
          if (JVar5 == 2) {
            pcVar6 = json_string(value);
            iVar4 = strcmp(pcVar6,"ground");
            if (iVar4 == 0) {
              local_2f0.f = (posFlagsTy)((ushort)local_2f0.f & 0xfcff | 0x200);
              local_2f0._alt = NAN;
            }
          }
          else if (JVar5 == 3) {
            local_2f0.f = (posFlagsTy)((ushort)local_2f0.f & 0xfcff | 0x100);
            dVar11 = json_number(value);
            dVar10 = jog_n_nan(pJAc,"nav_qnh");
            if (NAN(dVar10)) {
              dVar10 = (double)dataRefs.lastWeatherHPA;
            }
            dVar10 = BaroAltToGeoAlt_m(dVar11 * 0.3048,dVar10);
            local_2f0._alt = (dVar10 / 0.3048) * 0.3048;
          }
        }
        if ((((ushort)local_2f0.f & 0x300) == 0x200) || (!NAN(local_2f0._alt))) {
          pcVar6 = jog_s(pJAc,"r");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,pcVar6,(allocator<char> *)local_1c8);
          pcVar6 = jog_s(pJAc,"t");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,pcVar6,(allocator<char> *)local_1c8);
          pcVar6 = jog_s(pJAc,"category");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,pcVar6,(allocator<char> *)local_1c8);
          iVar4 = std::__cxx11::string::compare((char *)&local_2a8);
          if ((iVar4 == 0) ||
             (((iVar4 = std::__cxx11::string::compare((char *)&local_2a8), iVar4 == 0 ||
               (iVar4 = std::__cxx11::string::compare((char *)&local_258), iVar4 == 0)) ||
              (iVar4 = std::__cxx11::string::compare((char *)&local_288), iVar4 == 0)))) {
            std::__cxx11::string::_M_assign((string *)&local_288);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_258);
            if ((((iVar4 == 0) ||
                 (iVar4 = std::__cxx11::string::compare((char *)&local_288), iVar4 == 0)) ||
                (iVar4 = std::__cxx11::string::compare((char *)&local_2a8), iVar4 == 0)) ||
               (((((ushort)local_2f0.f & 0x300) == 0x200 && (local_280 == 0)) &&
                ((local_250 == 0 && (local_2a8._M_string_length == 0)))))) {
              std::__cxx11::string::operator=((string *)&local_288,"TWR");
              std::__cxx11::string::_M_assign((string *)&local_258);
              std::__cxx11::string::operator=((string *)&local_2a8,"C3");
            }
          }
          local_268._M_device = &mapFdMutex;
          local_268._M_owns = false;
          std::unique_lock<std::mutex>::lock(&local_268);
          local_268._M_owns = true;
          LTFlightData::CheckDupKey(fdKey,KEY_FLARM);
          if (fdKey->eKeyType == KEY_ADSBEX) {
            LTFlightData::CheckDupKey(fdKey,KEY_RT);
          }
          this_00 = std::
                    map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                    ::operator[](&mapFd,fdKey);
          iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this_00->dataAccessMutex);
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          std::unique_lock<std::mutex>::unlock(&local_268);
          if ((this_00->acKey).key._M_string_length == 0) {
            LTFlightData::SetKey(this_00,fdKey);
          }
          local_1c8._0_8_ = local_1c8 + 0x10;
          local_1c8._8_8_ = 0;
          local_1c8[0x10] = '\0';
          local_1c8._32_8_ = local_1c8 + 0x30;
          local_1c8._40_8_ = 0;
          local_1c8[0x30] = '\0';
          local_188._M_p = (pointer)&local_178;
          local_180 = 0;
          local_178._M_local_buf[0] = '\0';
          local_168._M_p = (pointer)&local_158;
          local_160 = 0;
          local_158._M_local_buf[0] = '\0';
          local_148._M_p = (pointer)&local_138;
          local_140 = 0;
          local_138._M_local_buf[0] = '\0';
          local_128._M_p = (pointer)&local_118;
          local_120 = (char *)0x0;
          local_118._M_local_buf[0] = '\0';
          local_108._0_4_ = -1;
          local_108._4_4_ = -1;
          local_100 = 0;
          local_fc = false;
          local_f8 = (Doc8643 *)0x0;
          local_f0._M_p = (pointer)&local_e0;
          local_e8 = (char *)0x0;
          local_e0._M_local_buf[0] = '\0';
          local_c0 = (pointer)0x0;
          local_d0 = (pointer)0x0;
          pbStack_c8 = (pointer)0x0;
          local_b8._M_p = (pointer)&local_a8;
          local_b0 = 0;
          local_a8._M_local_buf[0] = '\0';
          local_98._M_p = (pointer)&local_88;
          local_90 = 0;
          local_88._M_local_buf[0] = '\0';
          local_78._M_p = (pointer)&local_68;
          local_70 = 0;
          local_68._M_local_buf[0] = '\0';
          local_58._M_p = (pointer)&local_48;
          local_50 = 0;
          local_48._M_local_buf[0] = '\0';
          local_38._0_1_ = false;
          local_38._1_1_ = false;
          std::__cxx11::string::_M_assign((string *)local_1c8);
          std::__cxx11::string::_M_assign((string *)&local_188);
          dVar10 = json_object_dotget_number(pJAc,"dbFlags");
          lVar7 = lround(dVar10);
          local_fc = (bool)((byte)lVar7 & 1);
          pcVar8 = jog_s(pJAc,"flight");
          pcVar6 = local_e8;
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)&local_f0,0,pcVar6,(ulong)pcVar8);
          lVar7 = std::__cxx11::string::find_last_not_of
                            ((char *)&local_f0,0x246096,0xffffffffffffffff);
          pcVar6 = (char *)(lVar7 + 1);
          if (local_e8 < pcVar6) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase",pcVar6);
          }
          local_f0._M_p[(long)pcVar6] = '\0';
          local_e8 = pcVar6;
          std::__cxx11::string::find_first_not_of((char *)&local_f0,0x246096,0);
          std::__cxx11::string::erase((ulong)&local_f0,0);
          pcVar8 = GetADSBEmitterCat(&local_2a8);
          pcVar6 = local_120;
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)&local_128,0,pcVar6,(ulong)pcVar8);
          std::__cxx11::string::_M_assign((string *)&local_98);
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)(fdKey->key)._M_dataplus._M_p);
          LTFlightData::FDDynamicData::FDDynamicData(&local_210);
          dVar10 = jog_sn(pJAc,"squawk");
          local_210.radar.code = lround(dVar10);
          local_210.gnd = ((ushort)local_2f0.f & 0x300) == 0x200;
          local_210.heading = local_2f0._head;
          local_210.spd = jog_n_nan(pJAc,"gs");
          local_210.vsi = jog_n_nan(pJAc,"geom_rate");
          if (NAN(local_210.vsi)) {
            local_210.vsi = jog_n_nan(pJAc,"baro_rate");
          }
          local_210.ts = local_2f0._ts;
          local_210.pChannel = (LTChannel *)this;
          LTFlightData::UpdateData(this_00,(FDStaticData *)local_1c8,dVar9,DATREQU_NONE);
          bVar3 = positionTy::isNormal(&local_2f0,true);
          if (bVar3) {
            LTFlightData::AddDynData(this_00,&local_210,0,0,&local_2f0);
          }
          else if ((int)dataRefs.iLogLevel < 1) {
            pcVar1 = (fdKey->key)._M_dataplus._M_p;
            positionTy::dbgTxt_abi_cxx11_(&local_230,&local_2f0);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                   ,0x13a,"ProcessV2",logDEBUG,"A/c %s reached invalid pos: %s",pcVar1,
                   local_230._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
          }
          LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_1c8);
          pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
          std::unique_lock<std::mutex>::~unique_lock(&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if (local_288 != local_278) {
            operator_delete(local_288,local_278[0] + 1);
          }
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ADSBBase::ProcessV2 (const JSON_Object* pJAc,
                          LTFlightData::FDKeyTy& fdKey,
                          const double tBufPeriod,
                          const double adsbxTime,
                          const positionTy& viewPos)
{
    // skip stale data
    const double ageOfPos = jog_n(pJAc, ADSBEX_V2_SEE_POS);
    if (ageOfPos >= tBufPeriod)
        return;
    
    // skip TIS-B data...that is stuff that comes and goes with new ids every few requests, unusable
    if (!std::strcmp(jog_s(pJAc, ADSBEX_V2_TRANSP_TYPE),ADSBEX_V2_TYPE_TISB))
        return;
    
    // Try getting best possible position information
    // Some fields can come back NAN if not defined
    positionTy pos (jog_n_nan(pJAc, ADSBEX_V2_LAT),
                    jog_n_nan(pJAc, ADSBEX_V2_LON),
                    jog_n_nan(pJAc, ADSBEX_V2_ALT_GEOM) * M_per_FT,
                    adsbxTime - ageOfPos,
                    jog_n_nan(pJAc, ADSBEX_V2_HEADING));
    // If heading isn't available try track
    if (std::isnan(pos.heading()))
        pos.heading() = jog_n_nan(pJAc, ADSBEX_V2_TRACK);
    
    // If lat/lon isn't defined then the tracking data is stale: discard
    if (std::isnan(pos.lat()) || std::isnan(pos.lon()))
        return;
    
    // ADSBEx, especially the RAPID API version, returns
    // aircraft regardless of distance. To avoid planes
    // created and immediately removed due to distanced settings
    // we continue only if pos is within wanted range
    const double dist = pos.dist(viewPos);
    if (dist > dataRefs.GetFdStdDistance_m() )
        return;
    
    // The alt_baro field is string "ground" if on ground or can hold a baro altitude number
    const JSON_Value* pAltBaro = json_object_get_value(pJAc, ADSBEX_V2_ALT_BARO);
    if (pAltBaro) {
        switch (json_value_get_type(pAltBaro))
        {
            case JSONNumber:
            {
                pos.f.onGrnd = GND_OFF;         // we are definitely off ground
                // But we also process baro alt, potentially even overwriting a geo alt as baro alt is more accurate based on experience
                // try converting baro alt from given QNH, otherwise we use our own weather
                const double baro_alt = json_number(pAltBaro);
                const double qnh = jog_n_nan(pJAc, ADSBEX_V2_NAV_QNH);
                if (std::isnan(qnh))
                    pos.SetAltFt(BaroAltToGeoAlt_ft(baro_alt, dataRefs.GetPressureHPA()));
                else
                    pos.SetAltFt(BaroAltToGeoAlt_ft(baro_alt, qnh));
                break;
            }
                
            case JSONString:
                // There is just one string we are aware of: "ground"
                if (!strcmp(json_string(pAltBaro), "ground")) {
                    pos.f.onGrnd = GND_ON;
                    pos.alt_m() = NAN;
                }
                break;
        }
    }
    // _Some_ altitude info needs to be available now, otherwise skip data
    if (!pos.IsOnGnd() && std::isnan(pos.alt_m()))
        return;
    
    // Are we to skip static objects?
    std::string reg = jog_s(pJAc, ADSBEX_V2_REG);
    std::string acTy = jog_s(pJAc, ADSBEX_V2_AC_TYPE_ICAO);
    std::string cat = jog_s(pJAc, ADSBEX_V2_AC_CATEGORY);
    
    // Identify ground vehicles
    if (cat  == "C1"  || cat == "C2" ||
        reg  == "GND" ||
        acTy == "GND")
        acTy = dataRefs.GetDefaultCarIcaoType();
    // Mark all static objects equally, so they can optionally be hidden
    else if (reg  == STATIC_OBJECT_TYPE ||
             acTy == STATIC_OBJECT_TYPE ||
             cat  == "C3" ||
             // Everything else on the ground, which has no type, registration, category is considered static
             (pos.IsOnGnd() && acTy.empty() && reg.empty() && cat.empty()))

    {
        reg = acTy = STATIC_OBJECT_TYPE;
        cat = "C3";
    }

    // from here on access to fdMap guarded by a mutex
    // until FD object is inserted and updated
    std::unique_lock<std::mutex> mapFdLock (mapFdMutex);
    
    // Check for duplicates with OGN/FLARM, potentially replaces the key type
    LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_FLARM);
    // Some internal codes sometimes overlap with RealTraffic
    if (fdKey.eKeyType == LTFlightData::KEY_ADSBEX)
        LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_RT);

    // get the fd object from the map, key is the transpIcao
    // this fetches an existing or, if not existing, creates a new one
    LTFlightData& fd = mapFd[fdKey];
    
    // also get the data access lock once and for all
    // so following fetch/update calls only make quick recursive calls
    std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
    // now that we have the detail lock we can release the global one
    mapFdLock.unlock();
    
    // completely new? fill key fields
    if ( fd.empty() )
        fd.SetKey(fdKey);
    
    // -- fill static data --
    LTFlightData::FDStaticData stat;
    stat.reg =        reg;
    stat.acTypeIcao = acTy;
    stat.mil =        (jog_l(pJAc, ADSBEX_V2_FLAGS) & 0x01) == 0x01;
    stat.call =       jog_s(pJAc, ADSBEX_V2_FLIGHT);
    trim(stat.call);
    stat.catDescr = GetADSBEmitterCat(cat);
    stat.slug       = sSlugBase;
    stat.slug      += fdKey.key;
    
    // -- dynamic data --
    LTFlightData::FDDynamicData dyn;
    
    // non-positional dynamic data
    dyn.radar.code =        jog_sl(pJAc, ADSBEX_V2_RADAR_CODE);
    dyn.gnd =               pos.IsOnGnd();
    dyn.heading =           pos.heading();
    dyn.spd =               jog_n_nan(pJAc, ADSBEX_V2_SPD);
    dyn.vsi =               jog_n_nan(pJAc, ADSBEX_V2_VSI_GEOM);
    if (std::isnan(dyn.vsi))
        dyn.vsi =           jog_n_nan(pJAc, ADSBEX_V2_VSI_BARO);
    dyn.ts =                pos.ts();
    dyn.pChannel =          this;
    
    // update the a/c's master data
    fd.UpdateData(std::move(stat), dist);
    
    // position is rather important, we check for validity
    if ( pos.isNormal(true) ) {
        fd.AddDynData(dyn, 0, 0, &pos);
    }
    else
        LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
}